

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O0

void ImageDrawRectangleRec(Image *dst,Rectangle rec,Color color)

{
  int iVar1;
  int local_40;
  int local_3c;
  int x;
  int y;
  int ex;
  int sx;
  int ey;
  int sy;
  Image *dst_local;
  float fStack_18;
  Color color_local;
  Rectangle rec_local;
  
  if (((dst->data != (void *)0x0) && (dst->width != 0)) && (dst->height != 0)) {
    color_local = (Color)rec.y;
    local_3c = (int)(float)color_local;
    rec_local.y = rec.height;
    iVar1 = local_3c + (int)rec_local.y;
    fStack_18 = rec.x;
    rec_local.x = rec.width;
    for (; local_40 = (int)fStack_18, local_3c < iVar1; local_3c = local_3c + 1) {
      for (; local_40 < (int)fStack_18 + (int)rec_local.x; local_40 = local_40 + 1) {
        ImageDrawPixel(dst,local_40,local_3c,color);
      }
    }
  }
  return;
}

Assistant:

void ImageDrawRectangleRec(Image *dst, Rectangle rec, Color color)
{
    // Security check to avoid program crash
    if ((dst->data == NULL) || (dst->width == 0) || (dst->height == 0)) return;

    int sy = (int)rec.y;
    int ey = sy + (int)rec.height;

    int sx = (int)rec.x;
    int ex = sx + (int)rec.width;

    for (int y = sy; y < ey; y++)
    {
        for (int x = sx; x < ex; x++)
        {
            ImageDrawPixel(dst, x, y, color);
        }
    }
}